

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O0

void __thiscall
QWidgetTextControlPrivate::append(QWidgetTextControlPrivate *this,QString *text,TextFormat format)

{
  ulong uVar1;
  int in_EDX;
  QAnyStringView *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QTextCursor tmp;
  QTextCharFormat oldCharFormat;
  undefined4 in_stack_ffffffffffffff88;
  QAnyStringView *local_60;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::QTextCursor((QTextCursor *)&local_50,*(QTextDocument **)(in_RDI + 0x78));
  QTextCursor::beginEditBlock();
  QTextCursor::movePosition((MoveOperation)&local_50,0xb,0);
  uVar1 = QTextDocument::isEmpty();
  if ((uVar1 & 1) == 0) {
    QTextCursor::blockFormat();
    QTextCursor::charFormat();
    QTextCursor::insertBlock((QTextBlockFormat *)&local_50,(QTextCharFormat *)local_18);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x72075a);
    QTextBlockFormat::~QTextBlockFormat((QTextBlockFormat *)0x720764);
  }
  else {
    QTextCursor::charFormat();
    QTextCursor::setCharFormat((QTextCharFormat *)&local_50);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x720795);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextCursor::charFormat();
  if (in_EDX == 1) {
LAB_007207f5:
    QTextCursor::insertHtml((QString *)&local_50);
  }
  else {
    if (in_EDX == 2) {
      QAnyStringView::QAnyStringView(in_RSI,(QString *)CONCAT44(2,in_stack_ffffffffffffff88));
      uVar1 = Qt::mightBeRichText(local_60);
      if ((uVar1 & 1) != 0) goto LAB_007207f5;
    }
    QTextCursor::insertText((QString *)&local_50);
  }
  uVar1 = QTextCursor::hasSelection();
  if ((uVar1 & 1) == 0) {
    QTextCursor::setCharFormat((QTextCharFormat *)(in_RDI + 0x88));
  }
  QTextCursor::endEditBlock();
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x720858);
  QTextCursor::~QTextCursor((QTextCursor *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetTextControlPrivate::append(const QString &text, Qt::TextFormat format)
{
    QTextCursor tmp(doc);
    tmp.beginEditBlock();
    tmp.movePosition(QTextCursor::End);

    if (!doc->isEmpty())
        tmp.insertBlock(cursor.blockFormat(), cursor.charFormat());
    else
        tmp.setCharFormat(cursor.charFormat());

    // preserve the char format
    QTextCharFormat oldCharFormat = cursor.charFormat();

#ifndef QT_NO_TEXTHTMLPARSER
    if (format == Qt::RichText || (format == Qt::AutoText && Qt::mightBeRichText(text))) {
        tmp.insertHtml(text);
    } else {
        tmp.insertText(text);
    }
#else
    Q_UNUSED(format);
    tmp.insertText(text);
#endif // QT_NO_TEXTHTMLPARSER
    if (!cursor.hasSelection())
        cursor.setCharFormat(oldCharFormat);

    tmp.endEditBlock();
}